

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<int>::PrepareZ
          (TPZMatrix<int> *this,TPZFMatrix<int> *y,TPZFMatrix<int> *z,int beta,int opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar2 = (y->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar1,lVar2);
  if (0 < lVar2) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      lVar3 = (z->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
      if ((lVar3 < 1) || ((z->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (beta == 0) {
        if (lVar1 != 0) {
          memset(z->fElem + lVar3 * lVar6,0,lVar1 * 4);
        }
      }
      else {
        if (z != y) {
          memcpy(z->fElem + lVar3 * lVar6,
                 y->fElem + (y->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow * lVar6,lVar1 * 4);
        }
        if (0 < lVar1) {
          lVar3 = (z->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
          lVar7 = 0;
          do {
            if ((lVar3 <= lVar7) || ((z->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar6)) {
              TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar4 = lVar5 * lVar3;
            *(int *)((long)z->fElem + lVar7 * 4 + lVar4) =
                 *(int *)((long)z->fElem + lVar7 * 4 + lVar4) * beta;
            lVar7 = lVar7 + 1;
          } while (lVar1 != lVar7);
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 4;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}